

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

ReduceLogSumLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_reducelogsum(NeuralNetworkLayer *this)

{
  ReduceLogSumLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x505) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x505;
    this_00 = (ReduceLogSumLayerParams *)operator_new(0x30);
    ReduceLogSumLayerParams::ReduceLogSumLayerParams(this_00);
    (this->layer_).reducelogsum_ = this_00;
  }
  return (ReduceLogSumLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ReduceLogSumLayerParams* NeuralNetworkLayer::mutable_reducelogsum() {
  if (!has_reducelogsum()) {
    clear_layer();
    set_has_reducelogsum();
    layer_.reducelogsum_ = new ::CoreML::Specification::ReduceLogSumLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.reduceLogSum)
  return layer_.reducelogsum_;
}